

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O0

UBool utm_hasCapacity(UToolMemory *mem,int32_t capacity)

{
  void *pvVar1;
  int local_18;
  int32_t newCapacity;
  int32_t capacity_local;
  UToolMemory *mem_local;
  
  if (mem->capacity < capacity) {
    if (mem->maxCapacity < capacity) {
      fprintf(_stderr,"error: %s - trying to use more than maxCapacity=%ld units\n",mem,
              (long)mem->maxCapacity);
      exit(7);
    }
    local_18 = capacity;
    if (SBORROW4(capacity,mem->capacity * 2) != capacity + mem->capacity * -2 < 0) {
      if (mem->maxCapacity / 3 < mem->capacity) {
        local_18 = mem->maxCapacity;
      }
      else {
        local_18 = mem->capacity << 1;
      }
    }
    if ((UAlignedMemory *)mem->array == mem->staticArray) {
      pvVar1 = uprv_malloc_63((long)(local_18 * mem->size));
      mem->array = pvVar1;
      if (mem->array != (void *)0x0) {
        memcpy(mem->array,mem->staticArray,(long)mem->idx * (long)mem->size);
      }
    }
    else {
      pvVar1 = uprv_realloc_63(mem->array,(long)(local_18 * mem->size));
      mem->array = pvVar1;
    }
    if (mem->array == (void *)0x0) {
      fprintf(_stderr,"error: %s - out of memory\n",mem);
      exit(7);
    }
    mem->capacity = local_18;
  }
  return '\x01';
}

Assistant:

static UBool
utm_hasCapacity(UToolMemory *mem, int32_t capacity) {
    if(mem->capacity<capacity) {
        int32_t newCapacity;

        if(mem->maxCapacity<capacity) {
            fprintf(stderr, "error: %s - trying to use more than maxCapacity=%ld units\n",
                    mem->name, (long)mem->maxCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        /* try to allocate a larger array */
        if(capacity>=2*mem->capacity) {
            newCapacity=capacity;
        } else if(mem->capacity<=mem->maxCapacity/3) {
            newCapacity=2*mem->capacity;
        } else {
            newCapacity=mem->maxCapacity;
        }

        if(mem->array==mem->staticArray) {
            mem->array=uprv_malloc(newCapacity*mem->size);
            if(mem->array!=NULL) {
                uprv_memcpy(mem->array, mem->staticArray, (size_t)mem->idx*mem->size);
            }
        } else {
            mem->array=uprv_realloc(mem->array, newCapacity*mem->size);
        }

        if(mem->array==NULL) {
            fprintf(stderr, "error: %s - out of memory\n", mem->name);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        mem->capacity=newCapacity;
    }

    return TRUE;
}